

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O0

void __thiscall
FormatToTest_FormatToMemoryBuffer_Test::~FormatToTest_FormatToMemoryBuffer_Test
          (FormatToTest_FormatToMemoryBuffer_Test *this)

{
  void *in_RDI;
  
  ~FormatToTest_FormatToMemoryBuffer_Test((FormatToTest_FormatToMemoryBuffer_Test *)0x19f3d8);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(FormatToTest, FormatToMemoryBuffer) {
  fmt::basic_memory_buffer<char, 100> buffer;
  fmt::format_to(buffer, "{}", "foo");
  EXPECT_EQ("foo", to_string(buffer));
  fmt::wmemory_buffer wbuffer;
  fmt::format_to(wbuffer, L"{}", L"foo");
  EXPECT_EQ(L"foo", to_string(wbuffer));
}